

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

void spvtools::val::printDominatorList(BasicBlock *b)

{
  ostream *poVar1;
  BasicBlock *pBVar2;
  char *pcVar3;
  
  pcVar3 = " is dominated by: ";
  while( true ) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1,pcVar3);
    pBVar2 = BasicBlock::immediate_dominator(b);
    if (pBVar2 == b) break;
    b = BasicBlock::immediate_dominator(b);
    pcVar3 = " ";
  }
  return;
}

Assistant:

void printDominatorList(const BasicBlock& b) {
  std::cout << b.id() << " is dominated by: ";
  const BasicBlock* bb = &b;
  while (bb->immediate_dominator() != bb) {
    bb = bb->immediate_dominator();
    std::cout << bb->id() << " ";
  }
}